

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O2

char * strof_entry_type(EntryType type)

{
  char *pcVar1;
  
  pcVar1 = "invalid";
  if ((type < 0x10) && ((0x890UL >> ((ulong)type & 0x3f) & 1) == 0)) {
    pcVar1 = strof_entry_type::ELEM_TYPE_names[type];
  }
  return pcVar1;
}

Assistant:

const char *strof_entry_type(EntryType type)
{
    static const char *ELEM_TYPE_names[] = {
        [ELEM_TYPE_s32]    = "s32",
        [ELEM_TYPE_u32]    = "u32",
        [ELEM_TYPE_s64]    = "s64",
        [ELEM_TYPE_u64]    = "u64",
        [ELEM_TYPE_st]     = "struct",
        [ELEM_TYPE_shm]    = "shm_ptr",
        [ELEM_TYPE_kobj]   = "kobj",
        [ELEM_TYPE_kptr]   = "kptr",
        [ELEM_TYPE_kfp]    = "kfunc_ptr",
        [ELEM_TYPE_uobj]   = "uobj",
        [ELEM_TYPE_uptr]   = "uptr",
        [ELEM_TYPE_ufp]    = "ufunc_ptr",
    };
    static const char *invalid_type_str = "invalid";

    if (type & (~ELEM_TYPE_BUTT))
        return invalid_type_str;

    return ELEM_TYPE_names[type] ? ELEM_TYPE_names[type] : invalid_type_str;
}